

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O1

int gmath::anon_unknown_23::averageAngleAxisOpt(int n,double *x,int m,double *fvec,void *up)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  int i;
  long lVar4;
  undefined8 *puVar5;
  double (*padVar6) [3];
  void *pvVar7;
  long lVar8;
  double (*padVar9) [3];
  int j;
  long lVar10;
  ulong uVar11;
  double ret;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  SMatrix<double,_3,_3> ret_3;
  Matrix33d Ra;
  Vector3d tmp;
  Matrix33d R;
  Matrix33d local_148;
  int local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined8 local_e8 [10];
  Vector3d local_98;
  double local_78 [9];
  
  local_98.v[0] = 0.0;
  local_98.v[1] = 0.0;
  local_98.v[2] = 0.0;
  local_148.v[0][0] = *x;
  local_148.v[0][1] = x[1];
  local_148.v[0][2] = x[2];
  dVar12 = 0.0;
  lVar4 = 0;
  do {
    dVar2 = local_148.v[0][lVar4];
    dVar12 = dVar12 + dVar2 * dVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  padVar9 = (double (*) [3])local_78;
  createR((Matrix33d *)padVar9,(Vector3d *)&local_148,dVar12);
  local_e8[6] = 0;
  local_e8[7] = 0;
  local_e8[4] = 0;
  local_e8[5] = 0;
  local_e8[2] = 0;
  local_e8[3] = 0;
  local_e8[0] = 0;
  local_e8[1] = 0;
  local_e8[8] = 0;
  lVar4 = 0;
  auVar13 = _DAT_00121070;
  do {
    if (SUB164(auVar13 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar13 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)((long)local_e8 + lVar4) = 0x3ff0000000000000;
      *(undefined8 *)((long)local_e8 + lVar4 + 0x20) = 0x3ff0000000000000;
    }
    lVar8 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 2;
    auVar13._8_8_ = lVar8 + 2;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x80);
  puVar5 = local_e8;
  lVar4 = 0;
  do {
    lVar8 = 0;
    padVar6 = padVar9;
    do {
      puVar5[lVar8] = (*(double (*) [3])*padVar6)[0];
      lVar8 = lVar8 + 1;
      padVar6 = padVar6 + 1;
    } while (lVar8 != 3);
    lVar4 = lVar4 + 1;
    puVar5 = puVar5 + 3;
    padVar9 = (double (*) [3])(*padVar9 + 1);
  } while (lVar4 != 3);
  local_f8 = -0x80000000;
  uStack_f4 = 0x80000000;
  uStack_f0 = 0x80000000;
  uStack_ec = 0x80000000;
  if (0 < m) {
    uVar11 = 0;
    pvVar7 = up;
    do {
      lVar4 = 0;
      dVar12 = 0.0;
      do {
        dVar2 = *(double *)((long)pvVar7 + lVar4 * 8);
        dVar12 = dVar12 + dVar2 * dVar2;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      if (dVar12 < 0.0) {
        dVar12 = sqrt(dVar12);
      }
      else {
        dVar12 = SQRT(dVar12);
      }
      createR((Matrix33d *)local_78,(Vector3d *)((long)up + uVar11 * 0x18),dVar12);
      iVar3 = local_f8;
      local_148.v[2][0] = 0.0;
      local_148.v[2][1] = 0.0;
      local_148.v[1][1] = 0.0;
      local_148.v[1][2] = 0.0;
      local_148.v[0][2] = 0.0;
      local_148.v[1][0] = 0.0;
      local_148.v[0][0] = 0.0;
      local_148.v[0][1] = 0.0;
      local_148.v[2][2] = 0.0;
      lVar4 = 0;
      auVar14 = _DAT_00121070;
      do {
        if (SUB164(auVar14 ^ _DAT_00121080,4) == iVar3 &&
            SUB164(auVar14 ^ _DAT_00121080,0) < -0x7ffffffd) {
          *(undefined8 *)((long)local_148.v[0] + lVar4) = 0x3ff0000000000000;
          *(undefined8 *)((long)local_148.v[1] + lVar4 + 8) = 0x3ff0000000000000;
        }
        lVar8 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 2;
        auVar14._8_8_ = lVar8 + 2;
        lVar4 = lVar4 + 0x40;
      } while (lVar4 != 0x80);
      puVar5 = local_e8;
      lVar4 = 0;
      do {
        lVar8 = 0;
        padVar9 = (double (*) [3])local_78;
        do {
          pdVar1 = local_148.v[lVar4] + lVar8;
          *pdVar1 = 0.0;
          dVar12 = 0.0;
          lVar10 = 0;
          padVar6 = padVar9;
          do {
            dVar12 = dVar12 + (double)puVar5[lVar10] * (*(double (*) [3])*padVar6)[0];
            lVar10 = lVar10 + 1;
            padVar6 = padVar6 + 1;
          } while (lVar10 != 3);
          *pdVar1 = dVar12;
          lVar8 = lVar8 + 1;
          padVar9 = (double (*) [3])(*padVar9 + 1);
        } while (lVar8 != 3);
        lVar4 = lVar4 + 1;
        puVar5 = puVar5 + 3;
      } while (lVar4 != 3);
      dVar12 = recoverAngleAxis(&local_148,&local_98);
      fvec[uVar11] = dVar12;
      uVar11 = uVar11 + 1;
      pvVar7 = (void *)((long)pvVar7 + 0x18);
    } while (uVar11 != (uint)m);
  }
  return 0;
}

Assistant:

int averageAngleAxisOpt(int n, double x[], int m, double fvec[], void *up)
{
  Vector3d *v=reinterpret_cast<Vector3d *>(up);
  Vector3d tmp;

  Matrix33d Ra=transpose(createR(Vector3d(x[0], x[1], x[2])));

  for (int i=0; i<m; i++)
  {
    Matrix33d R=createR(v[i]);
    fvec[i]=recoverAngleAxis(Ra*R, tmp);
  }

  return 0;
}